

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.cc
# Opt level: O0

int MD4_Final(uchar *md,MD4_CTX *c)

{
  MD4_CTX *c_local;
  uint8_t *out_local;
  
  crypto_md32_final(md4_block_data_order,&c->A,(uint8_t *)c->data,0x40,&c->num,c->Nh,c->Nl,0);
  CRYPTO_store_u32_le(md,c->A);
  CRYPTO_store_u32_le(md + 4,c->B);
  CRYPTO_store_u32_le(md + 8,c->C);
  CRYPTO_store_u32_le(md + 0xc,c->D);
  return 1;
}

Assistant:

int MD4_Final(uint8_t out[MD4_DIGEST_LENGTH], MD4_CTX *c) {
  crypto_md32_final(&md4_block_data_order, c->h, c->data, MD4_CBLOCK, &c->num,
                    c->Nh, c->Nl, /*is_big_endian=*/0);

  CRYPTO_store_u32_le(out, c->h[0]);
  CRYPTO_store_u32_le(out + 4, c->h[1]);
  CRYPTO_store_u32_le(out + 8, c->h[2]);
  CRYPTO_store_u32_le(out + 12, c->h[3]);
  return 1;
}